

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O3

int generator_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  void *pvVar1;
  undefined4 uVar2;
  
  pvVar1 = segment->data;
  if (field == 0xb) {
    *(undefined4 *)value = *(undefined4 *)((long)pvVar1 + 8);
  }
  else {
    if (field == 10) {
      uVar2 = *(undefined4 *)((long)pvVar1 + 0xc);
    }
    else {
      if (field != 3) {
        mixed_err(7);
        return 0;
      }
      uVar2 = *(undefined4 *)((long)pvVar1 + 0x1c);
    }
    *(undefined4 *)value = uVar2;
  }
  return 1;
}

Assistant:

int generator_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct generator_segment_data *data = (struct generator_segment_data *)segment->data;
  
  switch(field){
  case MIXED_VOLUME:
    *((float *)value) = data->volume;
    break;
  case MIXED_GENERATOR_FREQUENCY:
    *((float *)value) = data->frequency;
    break;
  case MIXED_GENERATOR_TYPE:
    *((enum mixed_generator_type *)value) = data->type;
    break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}